

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  parse_mode *in_RDI;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *unaff_retaddr;
  uint in_stack_ffffffffffffffe8;
  
  *(undefined1 *)(in_RDI + 2) = accept;
  *(byte *)((long)in_RDI + 9) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x22a4f7);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::clear
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             0x22a52a);
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            (unaff_retaddr,in_RDI,(int *)0x0,(int *)(ulong)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void reset()
    {
        more_ = true;
        done_ = false;
        bytes_buffer_.clear();
        name_buffer_.clear();
        text_buffer_.clear();
        state_stack_.clear();
        state_stack_.emplace_back(parse_mode::root,0,0);
    }